

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O1

spv_result_t
spvTextToBinaryWithOptions
          (spv_const_context context,char *input_text,size_t input_text_size,uint32_t options,
          spv_binary *pBinary,spv_diagnostic *pDiagnostic)

{
  _Manager_type p_Var1;
  pointer __src;
  spv_target_env env;
  pointer psVar2;
  bool bVar3;
  spv_result_t sVar4;
  spv_result_t sVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  spv_instruction_t *inst_1;
  pointer psVar8;
  uint32_t *puVar9;
  spv_binary psVar10;
  char cVar11;
  iterator __end1;
  ulong uVar12;
  long lVar13;
  iterator __begin1;
  pointer psVar14;
  AssemblyGrammar grammar;
  spv_text_t text;
  vector<spv_instruction_t,_std::allocator<spv_instruction_t>_> instructions;
  spv_context_t hijack_context;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> ids_to_preserve;
  AssemblyContext context_1;
  spv_instruction_t inst;
  AssemblyGrammar local_430;
  spv_diagnostic *local_410;
  spv_text_t local_408;
  vector<spv_instruction_t,_std::allocator<spv_instruction_t>_> local_3f8;
  spv_context_t local_3d8;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_390;
  AssemblyContext local_360;
  undefined1 local_208 [16];
  _Link_type local_1f8;
  _Base_ptr p_Stack_1f0;
  _Base_ptr local_1e8;
  size_t sStack_1e0;
  spv_result_t local_38;
  
  local_3d8.target_env = context->target_env;
  local_3d8._4_4_ = *(undefined4 *)&context->field_0x4;
  local_3d8.opcode_table = context->opcode_table;
  local_3d8.operand_table._0_4_ = *(undefined4 *)&context->operand_table;
  local_3d8.operand_table._4_4_ = *(undefined4 *)((long)&context->operand_table + 4);
  local_3d8.ext_inst_table._0_4_ = *(undefined4 *)&context->ext_inst_table;
  local_3d8.ext_inst_table._4_4_ = *(undefined4 *)((long)&context->ext_inst_table + 4);
  local_3d8.consumer.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_3d8.consumer.super__Function_base._M_functor._8_8_ = 0;
  local_3d8.consumer.super__Function_base._M_manager = (_Manager_type)0x0;
  local_3d8.consumer._M_invoker = (_Invoker_type)0x0;
  p_Var1 = (context->consumer).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&local_3d8.consumer,(_Any_data *)&context->consumer,__clone_functor);
    local_3d8.consumer._M_invoker = (context->consumer)._M_invoker;
    local_3d8.consumer.super__Function_base._M_manager =
         (context->consumer).super__Function_base._M_manager;
  }
  if (pDiagnostic != (spv_diagnostic *)0x0) {
    *pDiagnostic = (spv_diagnostic)0x0;
    spvtools::UseDiagnosticAsMessageConsumer(&local_3d8,pDiagnostic);
  }
  local_430.target_env_ = local_3d8.target_env;
  local_430.operandTable_ =
       (spv_operand_table)CONCAT44(local_3d8.operand_table._4_4_,local_3d8.operand_table._0_4_);
  local_430.opcodeTable_ = local_3d8.opcode_table;
  local_430.extInstTable_ =
       (spv_ext_inst_table)CONCAT44(local_3d8.ext_inst_table._4_4_,local_3d8.ext_inst_table._0_4_);
  local_390._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_390._M_impl.super__Rb_tree_header._M_header;
  local_390._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_390._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_390._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_408.str = input_text;
  local_408.length = input_text_size;
  local_390._M_impl.super__Rb_tree_header._M_header._M_right =
       local_390._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((options & 2) != 0) {
    p_Stack_1f0 = (_Base_ptr)(local_208 + 8);
    local_1f8 = (_Link_type)0x0;
    local_208._0_8_ = 0;
    local_208._8_8_ = 0;
    sStack_1e0 = 0;
    local_1e8 = p_Stack_1f0;
    spvtools::AssemblyContext::AssemblyContext
              (&local_360,&local_408,&local_3d8.consumer,
               (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
               local_208);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::_M_erase((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                *)local_208,local_1f8);
    if (local_408.str == (char *)0x0) {
      spvtools::AssemblyContext::diagnostic
                ((DiagnosticStream *)local_208,&local_360,SPV_ERROR_INVALID_TEXT);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"Missing assembly text.",0x16);
      input_text = (char *)(ulong)(uint)local_38;
      spvtools::DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
    }
    else {
      bVar3 = spvtools::AssemblyGrammar::isValid(&local_430);
      input_text = (char *)0xfffffffa;
      if (bVar3) {
        spvtools::AssemblyContext::advance(&local_360);
        do {
          bVar3 = spvtools::AssemblyContext::hasText(&local_360);
          if (!bVar3) goto LAB_006314a1;
          local_1f8 = (_Link_type)0x0;
          p_Stack_1f0 = (_Base_ptr)0x0;
          local_1e8 = (_Base_ptr)0x0;
          local_208._0_4_ = 0x7fffffff;
          sVar4 = anon_unknown.dwarf_2afe3c3::spvTextEncodeOpcode
                            (&local_430,&local_360,(spv_instruction_t *)local_208);
          cVar11 = '\x01';
          if (sVar4 == SPV_SUCCESS) {
            sVar4 = spvtools::AssemblyContext::advance(&local_360);
            cVar11 = (sVar4 != SPV_SUCCESS) * '\x03';
          }
          if (local_1f8 != (_Link_type)0x0) {
            operator_delete(local_1f8,(long)local_1e8 - (long)local_1f8);
          }
        } while (cVar11 == '\0');
        if (cVar11 == '\x03') {
LAB_006314a1:
          spvtools::AssemblyContext::GetNumericIds
                    ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     local_208,&local_360);
          std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::operator=
                    ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     &local_390,
                     (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     local_208);
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::_M_erase((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                      *)local_208,local_1f8);
          input_text = (char *)0x0;
        }
        else {
          input_text = (char *)0xfffffffb;
        }
      }
    }
    sVar4 = (spv_result_t)input_text;
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::_M_erase(&local_360.ids_to_preserve_._M_t,
               (_Link_type)
               local_360.ids_to_preserve_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
    if (local_360.consumer_.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_360.consumer_.super__Function_base._M_manager)
                ((_Any_data *)&local_360.consumer_,(_Any_data *)&local_360.consumer_,
                 __destroy_functor);
    }
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spv_ext_inst_type_t>,_std::allocator<std::pair<const_unsigned_int,_spv_ext_inst_type_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_360.import_id_to_ext_inst_type_._M_h);
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_360.value_types_._M_h);
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::IdType>,_std::allocator<std::pair<const_unsigned_int,_spvtools::IdType>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_360.types_._M_h);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&local_360);
    if (sVar4 != SPV_SUCCESS) goto LAB_00631869;
  }
  local_410 = pDiagnostic;
  spvtools::AssemblyContext::AssemblyContext
            (&local_360,&local_408,&local_3d8.consumer,
             (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&local_390
            );
  if (local_408.str == (char *)0x0) {
    spvtools::AssemblyContext::diagnostic
              ((DiagnosticStream *)local_208,&local_360,SPV_ERROR_INVALID_TEXT);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,"Missing assembly text.",0x16);
    spvtools::DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
    sVar4 = local_38;
  }
  else {
    bVar3 = spvtools::AssemblyGrammar::isValid(&local_430);
    sVar4 = SPV_ERROR_INVALID_TABLE;
    if (bVar3) {
      if (pBinary == (spv_binary *)0x0) {
        sVar4 = SPV_ERROR_INVALID_POINTER;
      }
      else {
        local_3f8.super__Vector_base<spv_instruction_t,_std::allocator<spv_instruction_t>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_3f8.super__Vector_base<spv_instruction_t,_std::allocator<spv_instruction_t>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_3f8.super__Vector_base<spv_instruction_t,_std::allocator<spv_instruction_t>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        spvtools::AssemblyContext::advance(&local_360);
        do {
          bVar3 = spvtools::AssemblyContext::hasText(&local_360);
          if (!bVar3) goto LAB_006316be;
          local_208._0_8_ = 0;
          local_208._8_8_ = local_208._8_8_ & 0xffffffff00000000;
          local_1e8 = (_Base_ptr)0x0;
          local_1f8 = (_Link_type)0x0;
          p_Stack_1f0 = (_Base_ptr)0x0;
          std::vector<spv_instruction_t,_std::allocator<spv_instruction_t>_>::
          emplace_back<spv_instruction_t>(&local_3f8,(spv_instruction_t *)local_208);
          if (local_1f8 != (_Link_type)0x0) {
            operator_delete(local_1f8,(long)local_1e8 - (long)local_1f8);
          }
          sVar5 = anon_unknown.dwarf_2afe3c3::spvTextEncodeOpcode
                            (&local_430,&local_360,
                             local_3f8.
                             super__Vector_base<spv_instruction_t,_std::allocator<spv_instruction_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish + -1);
          cVar11 = '\x01';
          input_text = (char *)((ulong)input_text & 0xffffffff);
          if (sVar5 != SPV_SUCCESS) {
            input_text = (char *)(ulong)(uint)sVar5;
          }
          sVar4 = (spv_result_t)input_text;
          if (sVar5 == SPV_SUCCESS) {
            sVar5 = spvtools::AssemblyContext::advance(&local_360);
            cVar11 = (sVar5 != SPV_SUCCESS) * '\x03';
          }
        } while (cVar11 == '\0');
        if (cVar11 == '\x03') {
LAB_006316be:
          psVar2 = local_3f8.
                   super__Vector_base<spv_instruction_t,_std::allocator<spv_instruction_t>_>._M_impl
                   .super__Vector_impl_data._M_finish;
          psVar14 = local_3f8.
                    super__Vector_base<spv_instruction_t,_std::allocator<spv_instruction_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar12 = 5;
          for (psVar8 = local_3f8.
                        super__Vector_base<spv_instruction_t,_std::allocator<spv_instruction_t>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              psVar8 != local_3f8.
                        super__Vector_base<spv_instruction_t,_std::allocator<spv_instruction_t>_>.
                        _M_impl.super__Vector_impl_data._M_finish; psVar8 = psVar8 + 1) {
            uVar12 = uVar12 + ((long)(psVar8->words).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(psVar8->words).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 2);
          }
          sVar4 = SPV_SUCCESS;
          puVar9 = (uint32_t *)operator_new__(-(ulong)(uVar12 >> 0x3e != 0) | uVar12 * 4);
          if (psVar14 != psVar2) {
            lVar13 = 5;
            do {
              __src = (psVar14->words).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start;
              memcpy(puVar9 + lVar13,__src,
                     (long)(psVar14->words).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)__src);
              lVar13 = lVar13 + ((long)(psVar14->words).
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(psVar14->words).
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 2);
              psVar14 = psVar14 + 1;
            } while (psVar14 != psVar2);
          }
          env = local_430.target_env_;
          uVar6 = spvtools::AssemblyContext::getBound(&local_360);
          *puVar9 = 0x7230203;
          uVar7 = spvVersionForTargetEnv(env);
          puVar9[1] = uVar7;
          puVar9[2] = 0x70000;
          puVar9[3] = uVar6;
          puVar9[4] = 0;
          psVar10 = (spv_binary)operator_new(0x10);
          psVar10->code = (uint32_t *)0x0;
          psVar10->wordCount = 0;
          psVar10->code = puVar9;
          psVar10->wordCount = uVar12;
          *pBinary = psVar10;
        }
        std::vector<spv_instruction_t,_std::allocator<spv_instruction_t>_>::~vector(&local_3f8);
      }
    }
  }
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::_M_erase(&local_360.ids_to_preserve_._M_t,
             (_Link_type)
             local_360.ids_to_preserve_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  if (local_360.consumer_.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_360.consumer_.super__Function_base._M_manager)
              ((_Any_data *)&local_360.consumer_,(_Any_data *)&local_360.consumer_,__destroy_functor
              );
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spv_ext_inst_type_t>,_std::allocator<std::pair<const_unsigned_int,_spv_ext_inst_type_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_360.import_id_to_ext_inst_type_._M_h);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_360.value_types_._M_h);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::IdType>,_std::allocator<std::pair<const_unsigned_int,_spvtools::IdType>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_360.types_._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_360);
  pDiagnostic = local_410;
LAB_00631869:
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::_M_erase(&local_390,(_Link_type)local_390._M_impl.super__Rb_tree_header._M_header._M_parent);
  if ((pDiagnostic != (spv_diagnostic *)0x0) && (*pDiagnostic != (spv_diagnostic)0x0)) {
    (*pDiagnostic)->isTextSource = true;
  }
  if (local_3d8.consumer.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_3d8.consumer.super__Function_base._M_manager)
              ((_Any_data *)&local_3d8.consumer,(_Any_data *)&local_3d8.consumer,__destroy_functor);
  }
  return sVar4;
}

Assistant:

spv_result_t spvTextToBinaryWithOptions(const spv_const_context context,
                                        const char* input_text,
                                        const size_t input_text_size,
                                        const uint32_t options,
                                        spv_binary* pBinary,
                                        spv_diagnostic* pDiagnostic) {
  spv_context_t hijack_context = *context;
  if (pDiagnostic) {
    *pDiagnostic = nullptr;
    spvtools::UseDiagnosticAsMessageConsumer(&hijack_context, pDiagnostic);
  }

  spv_text_t text = {input_text, input_text_size};
  spvtools::AssemblyGrammar grammar(&hijack_context);

  spv_result_t result = spvTextToBinaryInternal(
      grammar, hijack_context.consumer, &text, options, pBinary);
  if (pDiagnostic && *pDiagnostic) (*pDiagnostic)->isTextSource = true;

  return result;
}